

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool CheckWitnessMalleation
               (CBlock *block,bool expect_witness_commitment,BlockValidationState *state)

{
  element_type *peVar1;
  pointer pCVar2;
  char *pcVar3;
  pointer pCVar4;
  long *plVar5;
  undefined8 *puVar6;
  uchar *data;
  undefined1 *puVar7;
  bool bVar8;
  byte bVar9;
  pointer psVar10;
  long lVar11;
  pointer psVar12;
  ulong uVar13;
  undefined7 in_register_00000031;
  size_type *psVar14;
  long lVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Span<unsigned_char> output;
  uint256 hash_witness;
  string local_e8;
  undefined1 local_c8 [32];
  uchar local_a8 [80];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,expect_witness_commitment) == 0) {
    psVar10 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar12 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
LAB_00af914c:
    bVar9 = 1;
    for (; psVar10 != psVar12; psVar10 = psVar10 + 1) {
      if (((psVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_has_witness == true) {
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"unexpected-witness","");
        tinyformat::format<char[23]>
                  (&local_58,"%s : unexpected witness data found",
                   (char (*) [23])"CheckWitnessMalleation");
        bVar8 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                           (string *)local_c8,&local_58);
        state = (BlockValidationState *)(ulong)bVar8;
        puVar7 = (undefined1 *)
                 CONCAT17(local_58._M_dataplus._M_p._7_1_,
                          CONCAT16(local_58._M_dataplus._M_p._6_1_,
                                   CONCAT15(local_58._M_dataplus._M_p._5_1_,
                                            CONCAT14(local_58._M_dataplus._M_p._4_1_,
                                                     CONCAT13(local_58._M_dataplus._M_p._3_1_,
                                                              CONCAT12(local_58._M_dataplus._M_p.
                                                                       _2_1_,CONCAT11(local_58.
                                                  _M_dataplus._M_p._1_1_,
                                                  (char)local_58._M_dataplus._M_p)))))));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7 != &local_58.field_2) {
          operator_delete(puVar7,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        bVar9 = 0;
        break;
      }
    }
  }
  else {
    bVar9 = 1;
    if (block->m_checked_witness_commitment != false) goto LAB_00af9201;
    psVar10 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar12 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar10 != psVar12) {
      peVar1 = (psVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar2 = (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = (long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar2;
      if (lVar15 != 0) {
        lVar15 = (lVar15 >> 3) * -0x3333333333333333;
        psVar14 = (size_type *)((long)&pCVar2->scriptPubKey + 0x1c);
        uVar13 = 0xffffffff;
        uVar16 = 0;
        do {
          if (((((0x42 < *psVar14) &&
                (pcVar3 = *(char **)&((CScriptBase *)(psVar14 + -7))->_union, *pcVar3 == 'j')) &&
               (pcVar3[1] == '$')) && ((pcVar3[2] == -0x56 && (pcVar3[3] == '!')))) &&
             ((pcVar3[4] == -0x57 && (pcVar3[5] == -0x13)))) {
            uVar13 = uVar16 & 0xffffffff;
          }
          uVar16 = uVar16 + 1;
          psVar14 = psVar14 + 10;
        } while (lVar15 + (ulong)(lVar15 == 0) != uVar16);
        if ((int)uVar13 != -1) {
          pCVar4 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pCVar4 == (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            __assert_fail("!block.vtx.empty() && !block.vtx[0]->vin.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0xf76,
                          "bool CheckWitnessMalleation(const CBlock &, bool, BlockValidationState &)"
                         );
          }
          plVar5 = (long *)(pCVar4->scriptWitness).stack.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          if (((long)*(pointer *)
                      ((long)&(pCVar4->scriptWitness).stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) - (long)plVar5 == 0x18) &&
             (plVar5[1] - *plVar5 == 0x20)) {
            BlockWitnessMerkleRoot((uint256 *)&local_58,block,(bool *)0x0);
            local_a8[0x30] = '\0';
            local_a8[0x31] = '\0';
            local_a8[0x32] = '\0';
            local_a8[0x33] = '\0';
            local_a8[0x34] = '\0';
            local_a8[0x35] = '\0';
            local_a8[0x36] = '\0';
            local_a8[0x37] = '\0';
            local_a8[0x38] = '\0';
            local_a8[0x39] = '\0';
            local_a8[0x3a] = '\0';
            local_a8[0x3b] = '\0';
            local_a8[0x3c] = '\0';
            local_a8[0x3d] = '\0';
            local_a8[0x3e] = '\0';
            local_a8[0x3f] = '\0';
            local_a8[0x20] = '\0';
            local_a8[0x21] = '\0';
            local_a8[0x22] = '\0';
            local_a8[0x23] = '\0';
            local_a8[0x24] = '\0';
            local_a8[0x25] = '\0';
            local_a8[0x26] = '\0';
            local_a8[0x27] = '\0';
            local_a8[0x28] = '\0';
            local_a8[0x29] = '\0';
            local_a8[0x2a] = '\0';
            local_a8[0x2b] = '\0';
            local_a8[0x2c] = '\0';
            local_a8[0x2d] = '\0';
            local_a8[0x2e] = '\0';
            local_a8[0x2f] = '\0';
            local_a8[0x10] = '\0';
            local_a8[0x11] = '\0';
            local_a8[0x12] = '\0';
            local_a8[0x13] = '\0';
            local_a8[0x14] = '\0';
            local_a8[0x15] = '\0';
            local_a8[0x16] = '\0';
            local_a8[0x17] = '\0';
            local_a8[0x18] = '\0';
            local_a8[0x19] = '\0';
            local_a8[0x1a] = '\0';
            local_a8[0x1b] = '\0';
            local_a8[0x1c] = '\0';
            local_a8[0x1d] = '\0';
            local_a8[0x1e] = '\0';
            local_a8[0x1f] = '\0';
            local_a8[0] = '\0';
            local_a8[1] = '\0';
            local_a8[2] = '\0';
            local_a8[3] = '\0';
            local_a8[4] = '\0';
            local_a8[5] = '\0';
            local_a8[6] = '\0';
            local_a8[7] = '\0';
            local_a8[8] = '\0';
            local_a8[9] = '\0';
            local_a8[10] = '\0';
            local_a8[0xb] = '\0';
            local_a8[0xc] = '\0';
            local_a8[0xd] = '\0';
            local_a8[0xe] = '\0';
            local_a8[0xf] = '\0';
            local_c8._16_8_ = 0;
            local_c8._24_4_ = 0;
            local_c8._28_4_ = 0;
            local_c8._0_8_ = (pointer)0x0;
            local_c8._8_8_ = 0;
            local_a8[0x40] = '\0';
            local_a8[0x41] = '\0';
            local_a8[0x42] = '\0';
            local_a8[0x43] = '\0';
            local_a8[0x44] = '\0';
            local_a8[0x45] = '\0';
            local_a8[0x46] = '\0';
            local_a8[0x47] = '\0';
            CSHA256::CSHA256((CSHA256 *)local_c8);
            CSHA256::Write((CSHA256 *)local_c8,(uchar *)&local_58,0x20);
            puVar6 = (undefined8 *)
                     (pCVar4->scriptWitness).stack.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            data = (uchar *)*puVar6;
            CSHA256::Write((CSHA256 *)local_c8,data,puVar6[1] - (long)data);
            output.m_size = 0x20;
            output.m_data = (uchar *)&local_58;
            CHash256::Finalize((CHash256 *)local_c8,output);
            lVar11 = (long)(int)uVar13;
            lVar15 = *(long *)&(((((block->vtx).
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>;
            if (*(uint *)(lVar15 + 0x24 + lVar11 * 0x28) < 0x1d) {
              lVar15 = lVar15 + lVar11 * 0x28 + 8;
            }
            else {
              lVar15 = *(long *)(lVar15 + 8 + lVar11 * 0x28);
            }
            auVar18[0] = -(*(char *)(lVar15 + 6) == (char)local_58._M_dataplus._M_p);
            auVar18[1] = -(*(char *)(lVar15 + 7) == local_58._M_dataplus._M_p._1_1_);
            auVar18[2] = -(*(char *)(lVar15 + 8) == local_58._M_dataplus._M_p._2_1_);
            auVar18[3] = -(*(char *)(lVar15 + 9) == local_58._M_dataplus._M_p._3_1_);
            auVar18[4] = -(*(char *)(lVar15 + 10) == local_58._M_dataplus._M_p._4_1_);
            auVar18[5] = -(*(char *)(lVar15 + 0xb) == local_58._M_dataplus._M_p._5_1_);
            auVar18[6] = -(*(char *)(lVar15 + 0xc) == local_58._M_dataplus._M_p._6_1_);
            auVar18[7] = -(*(char *)(lVar15 + 0xd) == local_58._M_dataplus._M_p._7_1_);
            auVar18[8] = -(*(char *)(lVar15 + 0xe) == (char)local_58._M_string_length);
            auVar18[9] = -(*(char *)(lVar15 + 0xf) == local_58._M_string_length._1_1_);
            auVar18[10] = -(*(char *)(lVar15 + 0x10) == local_58._M_string_length._2_1_);
            auVar18[0xb] = -(*(char *)(lVar15 + 0x11) == local_58._M_string_length._3_1_);
            auVar18[0xc] = -(*(char *)(lVar15 + 0x12) == local_58._M_string_length._4_1_);
            auVar18[0xd] = -(*(char *)(lVar15 + 0x13) == local_58._M_string_length._5_1_);
            auVar18[0xe] = -(*(char *)(lVar15 + 0x14) == local_58._M_string_length._6_1_);
            auVar18[0xf] = -(*(char *)(lVar15 + 0x15) == local_58._M_string_length._7_1_);
            auVar17[0] = -(*(char *)(lVar15 + 0x16) == (char)local_58.field_2._M_allocated_capacity)
            ;
            auVar17[1] = -(*(char *)(lVar15 + 0x17) == (char)((ulong)local_58.field_2._0_8_ >> 8));
            auVar17[2] = -(*(char *)(lVar15 + 0x18) == (char)((ulong)local_58.field_2._0_8_ >> 0x10)
                          );
            auVar17[3] = -(*(char *)(lVar15 + 0x19) == (char)((ulong)local_58.field_2._0_8_ >> 0x18)
                          );
            auVar17[4] = -(*(char *)(lVar15 + 0x1a) == (char)((ulong)local_58.field_2._0_8_ >> 0x20)
                          );
            auVar17[5] = -(*(char *)(lVar15 + 0x1b) == (char)((ulong)local_58.field_2._0_8_ >> 0x28)
                          );
            auVar17[6] = -(*(char *)(lVar15 + 0x1c) == (char)((ulong)local_58.field_2._0_8_ >> 0x30)
                          );
            auVar17[7] = -(*(char *)(lVar15 + 0x1d) == (char)((ulong)local_58.field_2._0_8_ >> 0x38)
                          );
            auVar17[8] = -(*(char *)(lVar15 + 0x1e) == (char)local_58.field_2._8_8_);
            auVar17[9] = -(*(char *)(lVar15 + 0x1f) == (char)((ulong)local_58.field_2._8_8_ >> 8));
            auVar17[10] = -(*(char *)(lVar15 + 0x20) ==
                           (char)((ulong)local_58.field_2._8_8_ >> 0x10));
            auVar17[0xb] = -(*(char *)(lVar15 + 0x21) ==
                            (char)((ulong)local_58.field_2._8_8_ >> 0x18));
            auVar17[0xc] = -(*(char *)(lVar15 + 0x22) ==
                            (char)((ulong)local_58.field_2._8_8_ >> 0x20));
            auVar17[0xd] = -(*(char *)(lVar15 + 0x23) ==
                            (char)((ulong)local_58.field_2._8_8_ >> 0x28));
            auVar17[0xe] = -(*(char *)(lVar15 + 0x24) ==
                            (char)((ulong)local_58.field_2._8_8_ >> 0x30));
            auVar17[0xf] = -(*(char *)(lVar15 + 0x25) ==
                            (char)((ulong)local_58.field_2._8_8_ >> 0x38));
            auVar17 = auVar17 & auVar18;
            if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
              block->m_checked_witness_commitment = true;
              bVar9 = 1;
              goto LAB_00af9201;
            }
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"bad-witness-merkle-match","");
            tinyformat::format<char[23]>
                      (&local_e8,"%s : witness merkle commitment mismatch",
                       (char (*) [23])"CheckWitnessMalleation");
            bVar9 = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                               (string *)local_c8,&local_e8);
            local_58.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_00af92a1;
          }
          else {
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"bad-witness-nonce-size","");
            tinyformat::format<char[23]>
                      (&local_58,"%s : invalid witness reserved value size",
                       (char (*) [23])"CheckWitnessMalleation");
            bVar9 = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                               (string *)local_c8,&local_58);
            local_e8._M_dataplus._M_p =
                 (pointer)CONCAT17(local_58._M_dataplus._M_p._7_1_,
                                   CONCAT16(local_58._M_dataplus._M_p._6_1_,
                                            CONCAT15(local_58._M_dataplus._M_p._5_1_,
                                                     CONCAT14(local_58._M_dataplus._M_p._4_1_,
                                                              CONCAT13(local_58._M_dataplus._M_p.
                                                                       _3_1_,CONCAT12(local_58.
                                                  _M_dataplus._M_p._2_1_,
                                                  CONCAT11(local_58._M_dataplus._M_p._1_1_,
                                                           (char)local_58._M_dataplus._M_p)))))));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_58.field_2) {
LAB_00af92a1:
              operator_delete(local_e8._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
          goto LAB_00af9201;
        }
      }
      goto LAB_00af914c;
    }
    bVar9 = 1;
  }
  bVar9 = bVar9 | (byte)state;
LAB_00af9201:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar9 & 1);
}

Assistant:

static bool CheckWitnessMalleation(const CBlock& block, bool expect_witness_commitment, BlockValidationState& state)
{
    if (expect_witness_commitment) {
        if (block.m_checked_witness_commitment) return true;

        int commitpos = GetWitnessCommitmentIndex(block);
        if (commitpos != NO_WITNESS_COMMITMENT) {
            assert(!block.vtx.empty() && !block.vtx[0]->vin.empty());
            const auto& witness_stack{block.vtx[0]->vin[0].scriptWitness.stack};

            if (witness_stack.size() != 1 || witness_stack[0].size() != 32) {
                return state.Invalid(
                    /*result=*/BlockValidationResult::BLOCK_MUTATED,
                    /*reject_reason=*/"bad-witness-nonce-size",
                    /*debug_message=*/strprintf("%s : invalid witness reserved value size", __func__));
            }

            // The malleation check is ignored; as the transaction tree itself
            // already does not permit it, it is impossible to trigger in the
            // witness tree.
            uint256 hash_witness = BlockWitnessMerkleRoot(block, /*mutated=*/nullptr);

            CHash256().Write(hash_witness).Write(witness_stack[0]).Finalize(hash_witness);
            if (memcmp(hash_witness.begin(), &block.vtx[0]->vout[commitpos].scriptPubKey[6], 32)) {
                return state.Invalid(
                    /*result=*/BlockValidationResult::BLOCK_MUTATED,
                    /*reject_reason=*/"bad-witness-merkle-match",
                    /*debug_message=*/strprintf("%s : witness merkle commitment mismatch", __func__));
            }

            block.m_checked_witness_commitment = true;
            return true;
        }
    }

    // No witness data is allowed in blocks that don't commit to witness data, as this would otherwise leave room for spam
    for (const auto& tx : block.vtx) {
        if (tx->HasWitness()) {
            return state.Invalid(
                /*result=*/BlockValidationResult::BLOCK_MUTATED,
                /*reject_reason=*/"unexpected-witness",
                /*debug_message=*/strprintf("%s : unexpected witness data found", __func__));
        }
    }

    return true;
}